

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  void *pvVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  char buf [64];
  ImVec2 local_80;
  char local_78 [72];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (format == (char *)0x0) {
      if (9 < (uint)data_type) {
        __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                      ,0x68e,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
      }
      format = GDataTypeInfo[(uint)data_type].PrintFmt;
    }
    DataTypeFormatString(local_78,0x40,data_type,p_data,format);
    uVar7 = (uint)((flags & 0x20002U) == 0) | flags | 0x200010;
    if (p_step == (void *)0x0) {
      bVar5 = false;
      bVar4 = InputText(label,local_78,0x40,uVar7,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar4) {
        bVar5 = DataTypeApplyOpFromText
                          (local_78,(pIVar3->InputTextState).InitialTextA.Data,data_type,p_data,
                           format);
      }
    }
    else {
      fVar8 = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar9 = CalcItemWidth();
      fVar10 = fVar8 + (pIVar3->Style).ItemInnerSpacing.x;
      fVar9 = fVar9 - (fVar10 + fVar10);
      fVar10 = 1.0;
      if (1.0 <= fVar9) {
        fVar10 = fVar9;
      }
      SetNextItemWidth(fVar10);
      bVar5 = false;
      bVar4 = InputText("",local_78,0x40,uVar7,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar4) {
        bVar5 = DataTypeApplyOpFromText
                          (local_78,(pIVar3->InputTextState).InitialTextA.Data,data_type,p_data,
                           format);
      }
      IVar2 = (pIVar3->Style).FramePadding;
      (pIVar3->Style).FramePadding.x = (pIVar3->Style).FramePadding.y;
      uVar7 = (flags & 0x4000U) >> 4 | 0x201;
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      local_80.x = fVar8;
      local_80.y = fVar8;
      bVar4 = ButtonEx("-",&local_80,uVar7);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      local_80.x = fVar8;
      local_80.y = fVar8;
      bVar4 = ButtonEx("+",&local_80,uVar7);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      if (text_end != label) {
        SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
        TextEx(label,text_end,0);
      }
      (pIVar3->Style).FramePadding = IVar2;
      PopID();
      EndGroup();
    }
    if (bVar5 != false) {
      MarkItemEdited((pIVar1->DC).LastItemId);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}